

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

bool google::protobuf::ServiceDescriptorProto::IsInitializedImpl(MessageLite *msg)

{
  bool bVar1;
  
  bVar1 = internal::AllAreInitialized<google::protobuf::MethodDescriptorProto>
                    ((RepeatedPtrField<google::protobuf::MethodDescriptorProto> *)
                     &msg[1]._internal_metadata_);
  if (bVar1) {
    if (((ulong)msg[1]._vptr_MessageLite & 2) != 0) {
      bVar1 = ServiceOptions::IsInitializedImpl((MessageLite *)msg[3]._internal_metadata_.ptr_);
      if (!bVar1) goto LAB_002301e6;
    }
    bVar1 = true;
  }
  else {
LAB_002301e6:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

PROTOBUF_NOINLINE bool ServiceDescriptorProto::IsInitializedImpl(
    const MessageLite& msg) {
  auto& this_ = static_cast<const ServiceDescriptorProto&>(msg);
  if (!::google::protobuf::internal::AllAreInitialized(this_._internal_method()))
    return false;
  if ((this_._impl_._has_bits_[0] & 0x00000002u) != 0) {
    if (!this_._impl_.options_->IsInitialized()) return false;
  }
  return true;
}